

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::RecordSet::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,RecordSet *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Record Set",10);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tID:            ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tSerial Number: ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tLength:        ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tCount:         ",0x11);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString RecordSet::GetAsString() const
{
    KStringStream ss;

    ss << "Record Set"
       << "\n\tID:            " << m_ui32RecID
       << "\n\tSerial Number: " << m_ui32RecSetSerialNum
       << "\n\tLength:        " << m_ui16RecLen
       << "\n\tCount:         " << m_ui16RecCnt
       << "\n";

    return ss.str();
}